

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaSAXHandleStartElementNs
               (void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces,
               xmlChar **namespaces,int nb_attributes,int nb_defaulted,xmlChar **attributes)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  xmlChar *pxVar4;
  void *pvVar5;
  ulong uVar6;
  char *message;
  uint uVar7;
  ulong uVar8;
  xmlChar xVar9;
  int iVar10;
  undefined4 in_register_00000084;
  xmlChar *pxVar11;
  int iVar12;
  xmlChar **ppxVar13;
  long lVar14;
  bool bVar15;
  xmlChar *in_stack_ffffffffffffffb8;
  
  pxVar11 = (xmlChar *)CONCAT44(in_register_00000084,nb_namespaces);
  iVar2 = *(int *)((long)ctx + 0xac) + 1;
  *(int *)((long)ctx + 0xac) = iVar2;
  if (*(int *)((long)ctx + 0x130) <= iVar2 && *(int *)((long)ctx + 0x130) != -1) {
    return;
  }
  iVar2 = xmlSchemaValidatorPushElem((xmlSchemaValidCtxtPtr)ctx);
  if (iVar2 == -1) {
    message = "calling xmlSchemaValidatorPushElem()";
  }
  else {
    lVar1 = *(long *)((long)ctx + 0xc0);
    iVar2 = xmlSAX2GetLineNumber(*(void **)((long)ctx + 0x50));
    *(int *)(lVar1 + 0x10) = iVar2;
    *(xmlChar **)(lVar1 + 0x18) = localname;
    *(xmlChar **)(lVar1 + 0x20) = URI;
    *(byte *)(lVar1 + 0x40) = *(byte *)(lVar1 + 0x40) | 0x20;
    if (0 < nb_namespaces) {
      iVar2 = *(int *)(lVar1 + 0x80);
      uVar7 = *(uint *)(lVar1 + 0x84);
      ppxVar13 = namespaces + 1;
      do {
        if (iVar2 < (int)uVar7) {
          pvVar5 = *(void **)(lVar1 + 0x78);
        }
        else {
          if ((int)uVar7 < 1) {
            uVar7 = 5;
          }
          else {
            if (999999999 < uVar7) goto LAB_00190624;
            uVar3 = uVar7 + 1 >> 1;
            bVar15 = 1000000000 - uVar3 < uVar7;
            uVar7 = uVar3 + uVar7;
            if (bVar15) {
              uVar7 = 1000000000;
            }
          }
          pvVar5 = (*xmlRealloc)(*(void **)(lVar1 + 0x78),(ulong)uVar7 << 4);
          if (pvVar5 == (void *)0x0) goto LAB_00190624;
          *(void **)(lVar1 + 0x78) = pvVar5;
          *(uint *)(lVar1 + 0x84) = uVar7;
          iVar2 = *(int *)(lVar1 + 0x80);
        }
        *(xmlChar **)((long)pvVar5 + (long)(iVar2 * 2) * 8) = ppxVar13[-1];
        pxVar4 = *ppxVar13;
        if (**ppxVar13 == '\0') {
          pxVar4 = (xmlChar *)0x0;
        }
        *(xmlChar **)(*(long *)(lVar1 + 0x78) + (long)(iVar2 * 2 + 1) * 8) = pxVar4;
        iVar2 = iVar2 + 1;
        *(int *)(lVar1 + 0x80) = iVar2;
        ppxVar13 = ppxVar13 + 2;
        nb_namespaces = nb_namespaces + -1;
      } while (nb_namespaces != 0);
    }
    if (0 < nb_attributes) {
      lVar14 = 0;
      iVar2 = 0;
      do {
        iVar12 = *(int *)(attributes + lVar14 + 4) - *(int *)(attributes + lVar14 + 3);
        pvVar5 = (*xmlMalloc)((long)(iVar12 + 1));
        if (pvVar5 == (void *)0x0) goto LAB_00190624;
        if (iVar12 < 1) {
          uVar6 = 0;
        }
        else {
          uVar6 = 0;
          uVar8 = 0;
          do {
            pxVar11 = attributes[lVar14 + 3];
            iVar10 = 1;
            xVar9 = pxVar11[uVar8];
            if (((((int)uVar8 < iVar12 + -4) && (xVar9 == '&')) &&
                (xVar9 = '&', pxVar11[uVar8 + 1] == '#')) &&
               ((pxVar11[uVar8 + 2] == '3' && (pxVar11[uVar8 + 3] == '8')))) {
              iVar10 = (uint)(pxVar11[uVar8 + 4] == ';') * 4 + 1;
            }
            *(xmlChar *)((long)pvVar5 + uVar6) = xVar9;
            uVar7 = (int)uVar8 + iVar10;
            uVar8 = (ulong)uVar7;
            uVar6 = uVar6 + 1;
          } while ((int)uVar7 < iVar12);
          uVar6 = uVar6 & 0xffffffff;
        }
        *(undefined1 *)((long)pvVar5 + uVar6) = 0;
        pxVar11 = attributes[lVar14 + 2];
        iVar12 = xmlSchemaValidatorPushAttribute
                           ((xmlSchemaValidCtxtPtr)ctx,(xmlNodePtr)0x0,*(int *)(lVar1 + 0x10),
                            attributes[lVar14],pxVar11,(int)pvVar5,in_stack_ffffffffffffffb8,
                            (int)ctx);
        if (iVar12 == -1) {
          message = "calling xmlSchemaValidatorPushAttribute()";
          goto LAB_00190656;
        }
        iVar2 = iVar2 + 1;
        lVar14 = lVar14 + 5;
      } while (iVar2 != nb_attributes);
    }
    iVar2 = xmlSchemaValidateElem((xmlSchemaValidCtxtPtr)ctx);
    if (iVar2 != -1) {
      return;
    }
    message = "calling xmlSchemaValidateElem()";
  }
LAB_00190656:
  xmlSchemaInternalErr2
            ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",message,(xmlChar *)0x0
             ,pxVar11);
LAB_00190660:
  ((xmlSchemaValidCtxtPtr)ctx)->err = -1;
  xmlStopParser(((xmlSchemaValidCtxtPtr)ctx)->parserCtxt);
  return;
LAB_00190624:
  xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)ctx);
  goto LAB_00190660;
}

Assistant:

static void
xmlSchemaSAXHandleStartElementNs(void *ctx,
				 const xmlChar * localname,
				 const xmlChar * prefix ATTRIBUTE_UNUSED,
				 const xmlChar * URI,
				 int nb_namespaces,
				 const xmlChar ** namespaces,
				 int nb_attributes,
				 int nb_defaulted ATTRIBUTE_UNUSED,
				 const xmlChar ** attributes)
{
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctx;
    int ret;
    xmlSchemaNodeInfoPtr ielem;
    int i, j;

    /*
    * SAX VAL TODO: What to do with nb_defaulted?
    */
    /*
    * Skip elements if inside a "skip" wildcard or invalid.
    */
    vctxt->depth++;
    if ((vctxt->skipDepth != -1) && (vctxt->depth >= vctxt->skipDepth))
	return;
    /*
    * Push the element.
    */
    if (xmlSchemaValidatorPushElem(vctxt) == -1) {
	VERROR_INT("xmlSchemaSAXHandleStartElementNs",
	    "calling xmlSchemaValidatorPushElem()");
	goto internal_error;
    }
    ielem = vctxt->inode;
    /*
    * TODO: Is this OK?
    */
    ielem->nodeLine = xmlSAX2GetLineNumber(vctxt->parserCtxt);
    ielem->localName = localname;
    ielem->nsName = URI;
    ielem->flags |= XML_SCHEMA_ELEM_INFO_EMPTY;
    /*
    * Register namespaces on the elem info.
    */
    if (nb_namespaces != 0) {
	/*
	* Although the parser builds its own namespace list,
	* we have no access to it, so we'll use an own one.
	*/
        for (i = 0, j = 0; i < nb_namespaces; i++, j += 2) {
	    /*
	    * Store prefix and namespace name.
	    */
            if (ielem->sizeNsBindings <= ielem->nbNsBindings) {
                const xmlChar **tmp;
                size_t elemSize = 2 * sizeof(tmp[0]);
                int newSize;

                newSize = xmlGrowCapacity(ielem->sizeNsBindings, elemSize,
                                          5, XML_MAX_ITEMS);
                if (newSize < 0) {
                    xmlSchemaVErrMemory(vctxt);
                    goto internal_error;
                }
                tmp = xmlRealloc(ielem->nsBindings, newSize * elemSize);
                if (tmp == NULL) {
                    xmlSchemaVErrMemory(vctxt);
                    goto internal_error;
                }

                ielem->nsBindings = tmp;
                ielem->sizeNsBindings = newSize;
	    }

	    ielem->nsBindings[ielem->nbNsBindings * 2] = namespaces[j];
	    if (namespaces[j+1][0] == 0) {
		/*
		* Handle xmlns="".
		*/
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] = NULL;
	    } else
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] =
		    namespaces[j+1];
	    ielem->nbNsBindings++;
	}
    }
    /*
    * Register attributes.
    * SAX VAL TODO: We are not adding namespace declaration
    * attributes yet.
    */
    if (nb_attributes != 0) {
	int valueLen, k, l;
	xmlChar *value;

        for (j = 0, i = 0; i < nb_attributes; i++, j += 5) {
	    /*
	    * Duplicate the value, changing any &#38; to a literal ampersand.
	    *
	    * libxml2 differs from normal SAX here in that it escapes all ampersands
	    * as &#38; instead of delivering the raw converted string. Changing the
	    * behavior at this point would break applications that use this API, so
	    * we are forced to work around it.
	    */
	    valueLen = attributes[j+4] - attributes[j+3];
	    value = xmlMalloc(valueLen + 1);
	    if (value == NULL) {
		xmlSchemaVErrMemory(vctxt);
		goto internal_error;
	    }
	    for (k = 0, l = 0; k < valueLen; l++) {
		if (k < valueLen - 4 &&
		    attributes[j+3][k+0] == '&' &&
		    attributes[j+3][k+1] == '#' &&
		    attributes[j+3][k+2] == '3' &&
		    attributes[j+3][k+3] == '8' &&
		    attributes[j+3][k+4] == ';') {
		    value[l] = '&';
		    k += 5;
		} else {
		    value[l] = attributes[j+3][k];
		    k++;
		}
	    }
	    value[l] = '\0';
	    /*
	    * TODO: Set the node line.
	    */
	    ret = xmlSchemaValidatorPushAttribute(vctxt,
		NULL, ielem->nodeLine, attributes[j], attributes[j+2], 0,
		value, 1);
	    if (ret == -1) {
		VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		    "calling xmlSchemaValidatorPushAttribute()");
		goto internal_error;
	    }
	}
    }
    /*
    * Validate the element.
    */
    ret = xmlSchemaValidateElem(vctxt);
    if (ret != 0) {
	if (ret == -1) {
	    VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		"calling xmlSchemaValidateElem()");
	    goto internal_error;
	}
	goto exit;
    }

exit:
    return;
internal_error:
    vctxt->err = -1;
    xmlStopParser(vctxt->parserCtxt);
}